

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal_replay.cpp
# Opt level: O1

void __thiscall duckdb::WriteAheadLogDeserializer::ReplayDropView(WriteAheadLogDeserializer *this)

{
  BinaryDeserializer *pBVar1;
  DropInfo info;
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 local_98 [48];
  _Alloc_hider local_68;
  char local_58 [16];
  _Alloc_hider local_48;
  char local_38 [24];
  _Tuple_impl<0UL,_duckdb::ExtraDropInfo_*,_std::default_delete<duckdb::ExtraDropInfo>_> local_20;
  
  DropInfo::DropInfo((DropInfo *)local_98);
  local_98[9] = 3;
  pBVar1 = &this->deserializer;
  (*(this->deserializer).super_Deserializer._vptr_Deserializer[2])(pBVar1,0x65,"schema");
  (*(pBVar1->super_Deserializer)._vptr_Deserializer[0x1a])(local_b8,pBVar1);
  (*(pBVar1->super_Deserializer)._vptr_Deserializer[3])(pBVar1);
  ::std::__cxx11::string::operator=((string *)&local_68,(string *)local_b8);
  if (local_b8[0] != local_a8) {
    operator_delete(local_b8[0]);
  }
  (*(pBVar1->super_Deserializer)._vptr_Deserializer[2])(pBVar1,0x66,"name");
  (*(pBVar1->super_Deserializer)._vptr_Deserializer[0x1a])(local_b8,pBVar1);
  (*(pBVar1->super_Deserializer)._vptr_Deserializer[3])(pBVar1);
  ::std::__cxx11::string::operator=((string *)&local_48,(string *)local_b8);
  if (local_b8[0] != local_a8) {
    operator_delete(local_b8[0]);
  }
  if (this->deserialize_only == false) {
    Catalog::DropEntry(this->catalog,this->context,(DropInfo *)local_98);
  }
  local_98._0_8_ = &PTR__DropInfo_0249a5b0;
  if (local_20.super__Head_base<0UL,_duckdb::ExtraDropInfo_*,_false>._M_head_impl !=
      (ExtraDropInfo *)0x0) {
    (**(code **)(*(long *)local_20.super__Head_base<0UL,_duckdb::ExtraDropInfo_*,_false>.
                          _M_head_impl + 8))();
  }
  local_20.super__Head_base<0UL,_duckdb::ExtraDropInfo_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::ExtraDropInfo_*,_false>)(ExtraDropInfo *)0x0;
  if (local_48._M_p != local_38) {
    operator_delete(local_48._M_p);
  }
  if (local_68._M_p != local_58) {
    operator_delete(local_68._M_p);
  }
  if ((undefined1 *)local_98._16_8_ != local_98 + 0x20) {
    operator_delete((void *)local_98._16_8_);
  }
  return;
}

Assistant:

void WriteAheadLogDeserializer::ReplayDropView() {
	DropInfo info;
	info.type = CatalogType::VIEW_ENTRY;
	info.schema = deserializer.ReadProperty<string>(101, "schema");
	info.name = deserializer.ReadProperty<string>(102, "name");
	if (DeserializeOnly()) {
		return;
	}
	catalog.DropEntry(context, info);
}